

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::_::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,CappedArray<char,_14UL> *params_2,
          ArrayPtr<const_char> *params_3,ArrayPtr<const_char> *params_4,
          ArrayPtr<const_char> *params_5)

{
  size_t size;
  char *target;
  ArrayPtr<const_char> *first;
  ArrayPtr<const_char> *rest;
  CappedArray<char,_14UL> *rest_1;
  ArrayPtr<const_char> *rest_2;
  ArrayPtr<const_char> *rest_3;
  ArrayPtr<const_char> *rest_4;
  size_type extraout_RDX;
  initializer_list<unsigned_long> nums;
  size_t local_80;
  size_t local_78;
  size_t local_70;
  size_t local_68;
  size_t local_60;
  size_t local_58;
  _ *local_50;
  undefined8 local_48;
  undefined1 local_39;
  ArrayPtr<const_char> *local_38;
  ArrayPtr<const_char> *params_local_4;
  ArrayPtr<const_char> *params_local_3;
  CappedArray<char,_14UL> *params_local_2;
  ArrayPtr<const_char> *params_local_1;
  ArrayPtr<const_char> *params_local;
  String *result;
  
  local_39 = 0;
  local_38 = params_3;
  params_local_4 = (ArrayPtr<const_char> *)params_2;
  params_local_3 = params_1;
  params_local_2 = (CappedArray<char,_14UL> *)params;
  params_local_1 = (ArrayPtr<const_char> *)this;
  params_local = (ArrayPtr<const_char> *)__return_storage_ptr__;
  local_80 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)this);
  local_78 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_local_2);
  local_70 = CappedArray<char,_14UL>::size((CappedArray<char,_14UL> *)params_local_3);
  local_68 = ArrayPtr<const_char>::size(params_local_4);
  local_60 = ArrayPtr<const_char>::size(local_38);
  local_58 = ArrayPtr<const_char>::size(params_4);
  local_50 = (_ *)&local_80;
  local_48 = 6;
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0x6;
  size = sum(local_50,nums);
  heapString(__return_storage_ptr__,size);
  target = String::begin(__return_storage_ptr__);
  first = fwd<kj::ArrayPtr<char_const>>(params_local_1);
  rest = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_2);
  rest_1 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_local_3);
  rest_2 = fwd<kj::ArrayPtr<char_const>>(params_local_4);
  rest_3 = fwd<kj::ArrayPtr<char_const>>(local_38);
  rest_4 = fwd<kj::ArrayPtr<char_const>>(params_4);
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (target,first,rest,rest_1,rest_2,rest_3,rest_4);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}